

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::
CreateTexture<unsigned_short,1,true,3u,true>(StorageAndSubImageTest *this)

{
  GLuint GVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLenum GVar6;
  GLenum GVar7;
  GLuint GVar8;
  GLuint GVar9;
  GLuint GVar10;
  GLenum format;
  GLenum type;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  ushort *data;
  StorageAndSubImageTest *this_00;
  Functions *gl;
  StorageAndSubImageTest *this_local;
  long lVar12;
  
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar11->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar12 + 0x6f8))(1,&this->m_to);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8bc);
  pcVar2 = *(code **)(lVar12 + 0xb8);
  GVar6 = TextureTarget<3u>();
  (*pcVar2)(GVar6,this->m_to);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8bf);
  GVar6 = TextureTarget<3u>();
  GVar1 = this->m_to;
  GVar7 = Reference::InternalFormat<unsigned_short,1,true>();
  GVar8 = TestReferenceDataWidth<3u>();
  GVar9 = TestReferenceDataHeight<3u>();
  GVar10 = TestReferenceDataDepth<3u>();
  this_00 = this;
  bVar3 = TextureStorage<3u,true>(this,GVar6,GVar1,1,GVar7,GVar8,GVar9,GVar10);
  if (bVar3) {
    GVar6 = TextureTarget<3u>();
    GVar1 = this->m_to;
    GVar7 = Reference::InternalFormat<unsigned_short,1,true>();
    GVar8 = TestReferenceDataWidth<3u>();
    GVar9 = TestReferenceDataHeight<3u>();
    GVar10 = TestReferenceDataDepth<3u>();
    format = Reference::Format<1,true>();
    type = Reference::Type<unsigned_short>();
    data = Reference::ReferenceData<unsigned_short,true>((Reference *)this_00);
    bVar3 = TextureSubImage<3u,true>(this,GVar6,GVar1,0,GVar7,GVar8,GVar9,GVar10,format,type,data);
    if (bVar3) {
      return true;
    }
  }
  CleanTexture(this);
  return false;
}

Assistant:

bool StorageAndSubImageTest::CreateTexture()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(TextureTarget<D>(), m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	/* Storage creation. */
	if (TextureStorage<D, I>(TextureTarget<D>(), m_to, 1, InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(),
							 TestReferenceDataHeight<D>(), TestReferenceDataDepth<D>()))
	{
		/* Data setup. */
		if (TextureSubImage<D, I>(TextureTarget<D>(), m_to, 0, InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(),
								  TestReferenceDataHeight<D>(), TestReferenceDataDepth<D>(), Format<S, N>(), Type<T>(),
								  ReferenceData<T, N>()))
		{
			return true;
		}
	}

	CleanTexture();

	return false;
}